

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::BufferRenderInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,BufferRenderInstance *this,
          ConstPixelBufferAccess *result)

{
  TestLog *log;
  bool bVar1;
  Surface reference;
  allocator<char> local_89;
  ConstPixelBufferAccess local_88;
  Surface local_60;
  undefined1 *local_48;
  float afStack_40 [2];
  Vec4 local_38;
  
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 1.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 1.0;
  local_48 = &DAT_3f8000003f800000;
  afStack_40[0] = 0.0;
  afStack_40[1] = 1.0;
  tcu::Surface::Surface
            (&local_60,
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[0],
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[1]);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_88,&local_60);
  drawQuadrantReferenceResult
            ((PixelBufferAccess *)&local_88,(Vec4 *)&local_48,&local_38,&local_38,(Vec4 *)&local_48)
  ;
  log = ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.super_TestInstance.
        m_context)->m_testCtx->m_log;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_88,&local_60);
  bVar1 = tcu::bilinearCompare
                    (log,"Compare","Result comparison",&local_88,result,(RGBA)0x1010101,
                     COMPARE_LOG_RESULT);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Pass",&local_89);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_88);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Image verification failed",&local_89);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_88);
  }
  std::__cxx11::string::~string((string *)&local_88);
  tcu::Surface::~Surface(&local_60);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferRenderInstance::verifyResultImage (const tcu::ConstPixelBufferAccess& result) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow		(1.0f, 1.0f, 0.0f, 1.0f);
	tcu::Surface		reference	(m_targetSize.x(), m_targetSize.y());

	drawQuadrantReferenceResult(reference.getAccess(), yellow, green, green, yellow);

	if (!bilinearCompare(m_context.getTestContext().getLog(), "Compare", "Result comparison", reference.getAccess(), result, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_RESULT))
		return tcu::TestStatus::fail("Image verification failed");
	else
		return tcu::TestStatus::pass("Pass");
}